

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

int TBufferNewPage(VP8TBuffer *b)

{
  long in_RDI;
  size_t size;
  VP8Tokens *page;
  undefined8 *puVar1;
  uint local_4;
  
  puVar1 = (undefined8 *)0x0;
  if (*(int *)(in_RDI + 0x20) == 0) {
    puVar1 = (undefined8 *)WebPSafeMalloc(0,(long)*(int *)(in_RDI + 0x1c) * 2 + 8);
  }
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = 0;
    **(undefined8 **)(in_RDI + 8) = puVar1;
    *(undefined8 **)(in_RDI + 8) = puVar1;
    *(undefined4 *)(in_RDI + 0x18) = *(undefined4 *)(in_RDI + 0x1c);
    *(undefined8 **)(in_RDI + 0x10) = puVar1 + 1;
  }
  else {
    *(undefined4 *)(in_RDI + 0x20) = 1;
  }
  local_4 = (uint)(puVar1 != (undefined8 *)0x0);
  return local_4;
}

Assistant:

static int TBufferNewPage(VP8TBuffer* const b) {
  VP8Tokens* page = NULL;
  if (!b->error) {
    const size_t size = sizeof(*page) + b->page_size * sizeof(token_t);
    page = (VP8Tokens*)WebPSafeMalloc(1ULL, size);
  }
  if (page == NULL) {
    b->error = 1;
    return 0;
  }
  page->next = NULL;

  *b->last_page = page;
  b->last_page = &page->next;
  b->left = b->page_size;
  b->tokens = (token_t*)TOKEN_DATA(page);
  return 1;
}